

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmberImproperTorsionType.hpp
# Opt level: O3

void __thiscall
OpenMD::AmberImproperTorsionType::AmberImproperTorsionType
          (AmberImproperTorsionType *this,RealType v2)

{
  _Rb_tree_header *p_Var1;
  DoublePolynomial *this_00;
  mapped_type_conflict *pmVar2;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  RealType c0;
  key_type local_30 [2];
  undefined1 local_28 [16];
  
  p_Var1 = &(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_PolynomialInversionType).super_InversionType._vptr_InversionType =
       (_func_int **)&PTR__PolynomialInversionType_003014a8;
  local_28._8_4_ = in_XMM0_Dc;
  local_28._0_8_ = v2;
  local_28._12_4_ = in_XMM0_Dd;
  this->v2_ = v2;
  this_00 = &(this->super_PolynomialInversionType).polynomial_;
  local_30[0] = 0;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,local_30);
  *pmVar2 = (mapped_type_conflict)local_28._0_8_;
  local_30[1] = 2;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,local_30 + 1);
  *pmVar2 = -local_28._0_8_;
  return;
}

Assistant:

AmberImproperTorsionType(RealType v2) : PolynomialInversionType(), v2_(v2) {
      // convert AmberImproper Torsion Type to Polynomial Inversion type
      RealType c0 = v2;
      RealType c2 = -v2;

      setCoefficient(0, c0);
      setCoefficient(2, c2);
    }